

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::StreamingReporterBase
          (StreamingReporterBase<Catch::CompactReporter> *this,ReporterConfig *_config)

{
  byte bVar1;
  ostream *poVar2;
  element_type *peVar3;
  size_type sVar4;
  ReporterConfig *in_RSI;
  IStreamingReporter *in_RDI;
  ReusableStringStream *in_stack_ffffffffffffff18;
  LazyStat<Catch::TestCaseInfo> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  *in_stack_ffffffffffffff30;
  string *msg;
  ReusableStringStream *this_00;
  
  IStreamingReporter::IStreamingReporter(in_RDI);
  in_RDI->_vptr_IStreamingReporter = (_func_int **)&PTR__StreamingReporterBase_00a14be0;
  ReporterConfig::fullConfig((ReporterConfig *)in_stack_ffffffffffffff18);
  poVar2 = ReporterConfig::stream(in_RSI);
  in_RDI[3]._vptr_IStreamingReporter = (_func_int **)poVar2;
  LazyStat<Catch::TestRunInfo>::LazyStat((LazyStat<Catch::TestRunInfo> *)in_stack_ffffffffffffff20);
  this_00 = (ReusableStringStream *)(in_RDI + 10);
  LazyStat<Catch::GroupInfo>::LazyStat((LazyStat<Catch::GroupInfo> *)in_stack_ffffffffffffff20);
  LazyStat<Catch::TestCaseInfo>::LazyStat(in_stack_ffffffffffffff20);
  msg = (string *)(in_RDI + 0x29);
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::vector
            ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)0x30d567);
  ReporterPreferences::ReporterPreferences((ReporterPreferences *)(in_RDI + 0x2c));
  *(undefined1 *)&in_RDI[0x2c]._vptr_IStreamingReporter = 0;
  getSupportedVerbosities();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x30d5a1);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x1a])();
  sVar4 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count(in_stack_ffffffffffffff30,
                (key_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = sVar4 != 0 ^ 0xff;
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
         0x30d5fc);
  if ((bVar1 & 1) == 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(this_00);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_ffffffffffffff20,
             (char (*) [47])in_stack_ffffffffffffff18);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff18);
  throw_domain_error(msg);
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }